

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O0

void __thiscall
vkt::texture::SampleVerifier::SampleVerifier
          (SampleVerifier *this,ImageViewParameters *imParams,SamplerParameters *samplerParams,
          SampleLookupSettings *sampleLookupSettings,int coordBits,int mipmapBits,
          FloatFormat *conversionPrecision,FloatFormat *filteringPrecision,
          vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *levels)

{
  int iVar1;
  int mipmapBits_local;
  int coordBits_local;
  SampleLookupSettings *sampleLookupSettings_local;
  SamplerParameters *samplerParams_local;
  ImageViewParameters *imParams_local;
  SampleVerifier *this_local;
  
  this->m_imParams = imParams;
  this->m_samplerParams = samplerParams;
  this->m_sampleLookupSettings = sampleLookupSettings;
  this->m_coordBits = coordBits;
  this->m_mipmapBits = mipmapBits;
  memcpy(&this->m_conversionPrecision,conversionPrecision,0x28);
  memcpy(&this->m_filteringPrecision,filteringPrecision,0x28);
  iVar1 = anon_unknown_7::calcUnnormalizedDim(imParams->dim);
  this->m_unnormalizedDim = iVar1;
  this->m_levels = levels;
  return;
}

Assistant:

SampleVerifier::SampleVerifier (const ImageViewParameters&						imParams,
								const SamplerParameters&						samplerParams,
								const SampleLookupSettings&						sampleLookupSettings,
								int												coordBits,
								int												mipmapBits,
								const tcu::FloatFormat&							conversionPrecision,
								const tcu::FloatFormat&							filteringPrecision,
								const std::vector<tcu::ConstPixelBufferAccess>&	levels)
	: m_imParams				(imParams)
	, m_samplerParams			(samplerParams)
	, m_sampleLookupSettings	(sampleLookupSettings)
	, m_coordBits				(coordBits)
	, m_mipmapBits				(mipmapBits)
	, m_conversionPrecision		(conversionPrecision)
	, m_filteringPrecision		(filteringPrecision)
	, m_unnormalizedDim			(calcUnnormalizedDim(imParams.dim))
	, m_levels					(levels)
{

}